

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDFace * __thiscall ON_SubDEdgePtr::RelativeFace(ON_SubDEdgePtr *this,int relative_face_index)

{
  ON_SubDFace *pOVar1;
  ON_SubDFace *f;
  ON__UINT_PTR ptr;
  ON_SubDFace *pOStack_38;
  unsigned_short efi;
  ON_SubDFace *LR [2];
  ON_SubDEdge *e;
  int relative_face_index_local;
  ON_SubDEdgePtr *this_local;
  
  if ((relative_face_index < 0) || (1 < relative_face_index)) {
    this_local = (ON_SubDEdgePtr *)0x0;
  }
  else {
    LR[1] = (ON_SubDFace *)(this->m_ptr & 0xfffffffffffffff8);
    if (LR[1] == (ON_SubDFace *)0x0) {
      this_local = (ON_SubDEdgePtr *)0x0;
    }
    else if ((LR[1] == (ON_SubDFace *)0x0) || (2 < (ushort)LR[1]->m_pack_id)) {
      this_local = (ON_SubDEdgePtr *)0x0;
    }
    else {
      memset(&stack0xffffffffffffffc8,0,0x10);
      for (ptr._6_2_ = 0; ptr._6_2_ < (ushort)LR[1]->m_pack_id; ptr._6_2_ = ptr._6_2_ + 1) {
        pOVar1 = (ON_SubDFace *)((ulong)LR[1]->m_pack_rect_origin[ptr._6_2_] & 0xfffffffffffffff8);
        if (pOVar1 != (ON_SubDFace *)0x0) {
          if (((ulong)LR[1]->m_pack_rect_origin[ptr._6_2_] & 1) == 0) {
            if (pOStack_38 != (ON_SubDFace *)0x0) {
              return (ON_SubDFace *)0x0;
            }
            pOStack_38 = pOVar1;
          }
          else {
            if (LR[0] != (ON_SubDFace *)0x0) {
              return (ON_SubDFace *)0x0;
            }
            LR[0] = pOVar1;
          }
        }
      }
      e._4_4_ = relative_face_index;
      if ((this->m_ptr & 1) != 0) {
        e._4_4_ = 1 - relative_face_index;
      }
      this_local = *(ON_SubDEdgePtr **)((long)&stack0xffffffffffffffc8 + (long)e._4_4_ * 8);
    }
  }
  return (ON_SubDFace *)this_local;
}

Assistant:

const class ON_SubDFace* ON_SubDEdgePtr::RelativeFace(
  int relative_face_index
) const
{
  if (relative_face_index < 0 || relative_face_index > 1)
    return nullptr; // invalid input
  
  const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_ptr);
  if (nullptr == e )
    return nullptr; // null input

  if (nullptr == e || e->m_face_count > 2)
    return nullptr; // nonmanifold edge

  const ON_SubDFace* LR[2] = {};
  for (unsigned short efi = 0; efi < e->m_face_count; ++efi)
  {
    const ON__UINT_PTR ptr = e->m_face2[efi].m_ptr;
    const ON_SubDFace* f = ON_SUBD_FACE_POINTER(ptr);
    if (nullptr == f)
      continue;
    if (0 == ON_SUBD_FACE_DIRECTION(ptr))
    {
      if (nullptr != LR[0])
        return nullptr; // not an oriented manifold interior edge
      LR[0] = f;
    }
    else
    {
      if (nullptr != LR[1])
        return nullptr; // not an oriented manifold interior edge
      LR[1] = f;
    }
  }

  if (0 != ON_SUBD_EDGE_DIRECTION(m_ptr))
    relative_face_index = 1 - relative_face_index;
  return LR[relative_face_index];
}